

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocale::dateTimeFormat(QString *__return_storage_ptr__,QLocale *this,FormatType format)

{
  bool bVar1;
  QSystemLocale *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined1 *puStack_70;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    local_48._16_8_ = 0;
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_30 = 2;
    (*pQVar2->_vptr_QSystemLocale[2])(&local_88,pQVar2,(ulong)(0x16 - (format == LongFormat)));
    ::QVariant::~QVariant((QVariant *)&local_48);
    bVar1 = ::QVariant::isNull((QVariant *)&local_88);
    if (!bVar1) {
      ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_88);
      ::QVariant::~QVariant((QVariant *)&local_88);
      goto LAB_002db692;
    }
    ::QVariant::~QVariant((QVariant *)&local_88);
  }
  dateFormat((QString *)&local_a8,this,format);
  local_48._16_8_ = local_a8.size;
  local_48._8_8_ = local_a8.ptr;
  local_48.shared = (PrivateShared *)local_a8.d;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  local_30 = CONCAT62(local_30._2_6_,0x20);
  timeFormat((QString *)&local_c0,this,format);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&local_88,
             (QStringBuilder<QString,_char16_t> *)&local_48,(QString *)&local_c0);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&local_88);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
LAB_002db692:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::dateTimeFormat(FormatType format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::DateTimeFormatLong
                                             : QSystemLocale::DateTimeFormatShort,
                                             QVariant());
        if (!res.isNull()) {
            return res.toString();
        }
    }
#endif
    return dateFormat(format) + u' ' + timeFormat(format);
}